

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *this,string *id,
          MultipoleAtypeParameters *data)

{
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_002c0708;
  MultipoleAtypeParameters::MultipoleAtypeParameters(&this->data_,data);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}